

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

SP __thiscall
pbrt::SingleLevelFlattener::getOrCreateEmittedShapeFrom(SingleLevelFlattener *this,SP *object)

{
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  mapped_type *pmVar3;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  *this_01;
  SP SVar6;
  SP ours;
  shared_ptr<pbrt::Shape> geom;
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar1 = ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
           &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
  if ((peVar1->shapes).
      super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (peVar1->shapes).
      super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = (map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
               *)(object + 1);
    pmVar3 = std::
             map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
             ::operator[](this_01,(key_type *)in_RDX._M_pi);
    if ((pmVar3->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) {
      local_68._16_8_ = this;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_68 + 0x18),"ShapeFrom:",
                     &((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
                      &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr->name);
      std::make_shared<pbrt::Object,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      this_00 = (__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18);
      std::__cxx11::string::~string((string *)this_00);
      peVar1 = ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
               &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
      p_Var2 = &((peVar1->shapes).
                 super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
      for (p_Var5 = &((peVar1->shapes).
                      super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>; p_Var5 != p_Var2;
          p_Var5 = p_Var5 + 1) {
        std::__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(this_00,p_Var5);
        std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
        push_back((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                   *)(local_68._0_8_ + 0x18),(value_type *)this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      }
      p_Var4 = &std::
                map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                ::operator[](this_01,(key_type *)in_RDX._M_pi)->
                super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var4,(__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)local_68);
      this = (SingleLevelFlattener *)local_68._16_8_;
      std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_,p_Var4);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      in_RDX._M_pi = extraout_RDX_00;
    }
    else {
      p_Var4 = &std::
                map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                ::operator[](this_01,(key_type *)in_RDX._M_pi)->
                super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var4);
      in_RDX._M_pi = extraout_RDX;
    }
  }
  SVar6.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar6.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar6.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Object::SP
    getOrCreateEmittedShapeFrom(Object::SP object)
    {
      if (object->shapes.empty()) return Object::SP();
      if (alreadyEmitted[object]) return alreadyEmitted[object];
      
      Object::SP ours = std::make_shared<Object>("ShapeFrom:"+object->name);
      for (auto geom : object->shapes)
        ours->shapes.push_back(geom);
      // light sources in instantiated objects aren't handled yet ...
      // for (auto lightSource : object->lightSources)
      //   ours->lightSources.push_back(lightSource);

      return alreadyEmitted[object] = ours;
    }